

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParser.cpp
# Opt level: O2

void __thiscall
AutoArgParse::ArgParser::printAllUsageInfo(ArgParser *this,ostream *os,string *programName)

{
  _Elt_pointer pPVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  reference this_00;
  PrintGroup *pg;
  _Elt_pointer pPVar5;
  _Elt_pointer pPVar6;
  _Map_pointer local_38;
  
  if ((this->helpFlag != (ComplexFlag<AutoArgParse::ArgParser::HelpFlagTrigger> *)0x0) &&
     (this->firstTimePrinting == true)) {
    this->firstTimePrinting = false;
    FlagStore::rotateLeft(&(this->super_ComplexFlag<AutoArgParse::DoNothingTrigger>).store);
  }
  poVar3 = std::operator<<(os,"Usage: ");
  std::operator<<(poVar3,(string *)programName);
  (*(this->super_ComplexFlag<AutoArgParse::DoNothingTrigger>).
    super_Flag<AutoArgParse::DoNothingTrigger>.super_FlagBase.super_ParseToken._vptr_ParseToken[4])
            (this,os);
  std::operator<<(os,"\n\nArguments:\n");
  sVar4 = std::deque<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>::size
                    (&this->printGroups);
  if (sVar4 == 1) {
    this_00 = std::deque<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>::at
                        (&this->printGroups,0);
    PrintGroup::printUsageHelp(this_00,os);
    return;
  }
  std::operator<<(os,
                  "The options are divided into the following groups.  Use --help group_name to detail the options under a particular group:\n"
                 );
  pPVar5 = (this->printGroups).
           super__Deque_base<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  pPVar6 = (this->printGroups).
           super__Deque_base<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
  local_38 = (this->printGroups).
             super__Deque_base<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  pPVar1 = (this->printGroups).
           super__Deque_base<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  bVar2 = true;
  while (pPVar5 != pPVar1) {
    if (!bVar2) {
      poVar3 = std::operator<<(os,(string *)&pPVar5->name);
      poVar3 = std::operator<<(poVar3,"  -- ");
      poVar3 = std::operator<<(poVar3,(string *)&pPVar5->description);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    pPVar5 = pPVar5 + 1;
    bVar2 = false;
    if (pPVar5 == pPVar6) {
      pPVar5 = local_38[1];
      local_38 = local_38 + 1;
      pPVar6 = pPVar5 + 2;
      bVar2 = false;
    }
  }
  if (this->helpFlag != (ComplexFlag<AutoArgParse::ArgParser::HelpFlagTrigger> *)0x0) {
    std::operator<<(os,"--help prints this message.\n");
    return;
  }
  return;
}

Assistant:

AUTOARGPARSE_INLINE void ArgParser::printAllUsageInfo(
    std::ostream& os, const std::string& programName) {
    if (helpFlag && firstTimePrinting) {
        firstTimePrinting = false;
        // help flag would have been the first thing added, move it to the end.
        store.rotateLeft();
    }
    os << "Usage: " << programName;
    printUsageSummary(os);
    os << "\n\nArguments:\n";
    if (printGroups.size() == 1) {
        printGroups.at(0).printUsageHelp(os);
        return;
    }
    os << "The options are divided into the following groups.  Use --help "
          "group_name to detail the options under a particular group:\n";
    bool first = true;
    for (auto& pg : printGroups) {
        if (first) {
            first = false;
            continue;
        }
        os << pg.getName() << "  -- " << pg.getDescription() << std::endl;
    }
    if (helpFlag) {
        os << "--help prints this message.\n";
    }
}